

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Graph::ts(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *this)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int u;
  int i;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_88;
  int local_84;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
  for (local_88 = 0; local_88 < this->size; local_88 = local_88 + 1) {
    if (this->inDegree[local_88] == 0) {
      std::deque<int,_std::allocator<int>_>::push_back
                ((deque<int,_std::allocator<int>_> *)&local_80,&local_88);
    }
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_88 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)&local_80);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_88);
    piVar2 = this->adjacencyVector[local_88].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar4 = this->adjacencyVector[local_88].super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
      local_84 = *piVar4;
      piVar3 = this->inDegree;
      piVar1 = piVar3 + local_84;
      *piVar1 = *piVar1 + -1;
      if (piVar3[local_84] == 0) {
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)&local_80,&local_84);
      }
    }
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
  return __return_storage_ptr__;
}

Assistant:

vector<int> Graph::ts(){
    queue<int> q;
    for (int i = 0; i < this->size; i++) {
        if (!this->inDegree[i]) {
            q.push(i);
        }
    }
    vector<int> temp;
    while (!q.empty()) {
        int u = q.front();
        q.pop();
        temp.push_back(u);
        for (int i : adjacencyVector[u]) {
            this->inDegree[i]--;
            if (!this->inDegree[i])
                q.push(i);
        }
    }
    return temp;
}